

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void State_init(void)

{
  int iVar1;
  s_x3node *psVar2;
  int i;
  
  if ((x3a == (s_x3 *)0x0) && (x3a = (s_x3 *)malloc(0x18), x3a != (s_x3 *)0x0)) {
    x3a->size = 0x80;
    x3a->count = 0;
    psVar2 = (s_x3node *)calloc(0x80,0x28);
    x3a->tbl = psVar2;
    if (x3a->tbl == (s_x3node *)0x0) {
      free(x3a);
      x3a = (s_x3 *)0x0;
    }
    else {
      x3a->ht = (s_x3node **)(x3a->tbl + 0x80);
      for (iVar1 = 0; iVar1 < 0x80; iVar1 = iVar1 + 1) {
        x3a->ht[iVar1] = (s_x3node *)0x0;
      }
    }
  }
  return;
}

Assistant:

void State_init(void){
  if( x3a ) return;
  x3a = (struct s_x3*)malloc( sizeof(struct s_x3) );
  if( x3a ){
    x3a->size = 128;
    x3a->count = 0;
    x3a->tbl = (x3node*)calloc(128, sizeof(x3node) + sizeof(x3node*));
    if( x3a->tbl==0 ){
      free(x3a);
      x3a = 0;
    }else{
      int i;
      x3a->ht = (x3node**)&(x3a->tbl[128]);
      for(i=0; i<128; i++) x3a->ht[i] = 0;
    }
  }
}